

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  Parameters *params_00;
  string local_a8;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_88;
  Parameters params_local;
  Environment env;
  
  params_00 = (Parameters *)params.size;
  params_local.memoryTypeIndex = (deUint32)params.size;
  params_local.size = (VkDeviceSize)context;
  Environment::Environment(&env,(Context *)this,1);
  DeviceMemory::create
            ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_88,&env,(Resources *)&params_local,
             params_00);
  local_a8.field_2._M_allocated_capacity = (size_type)local_88.m_data.deleter.m_device;
  local_a8.field_2._8_8_ = local_88.m_data.deleter.m_allocator;
  local_a8._M_dataplus._M_p = (pointer)local_88.m_data.object.m_internal;
  local_a8._M_string_length = (size_type)local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_88);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Ok",(allocator<char> *)&local_88);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}